

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O0

void cleanOSE(optionStackEntry *os)

{
  char *pcVar1;
  poptArgv ppcVar2;
  pbm_set *ppVar3;
  optionStackEntry *os_local;
  
  pcVar1 = (char *)_free(os->nextArg);
  os->nextArg = pcVar1;
  ppcVar2 = (poptArgv)_free(os->argv);
  os->argv = ppcVar2;
  ppVar3 = (pbm_set *)_free(os->argb);
  os->argb = ppVar3;
  return;
}

Assistant:

static void cleanOSE(struct optionStackEntry *os)
{
    os->nextArg = _free(os->nextArg);
    os->argv = _free(os->argv);
    os->argb = PBM_FREE(os->argb);
}